

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

bool __thiscall
BlockFilterIndex::LookupFilterRange
          (BlockFilterIndex *this,int start_height,CBlockIndex *stop_index,
          vector<BlockFilter,_std::allocator<BlockFilter>_> *filters_out)

{
  long lVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> *__range1;
  iterator __end1;
  DBVal *entry;
  pointer hash;
  pointer filter;
  long in_FS_OFFSET;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> entries;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entries.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entries.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entries.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = LookupRange(&((this->m_db)._M_t.
                        super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                        .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                       super_CDBWrapper,&(this->super_BaseIndex).m_name,start_height,stop_index,
                      &entries);
  pDVar2 = entries.
           super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  hash = entries.
         super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (bVar3) {
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::resize
              (filters_out,
               ((long)entries.
                      super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)entries.
                     super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x48);
    filter = (filters_out->super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (; bVar3 = hash == pDVar2, !bVar3; hash = hash + 1) {
      bVar4 = ReadFilterFromDisk(this,&hash->pos,&hash->hash,filter);
      if (!bVar4) break;
      filter = filter + 1;
    }
  }
  else {
    bVar3 = false;
  }
  std::vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>::~vector
            (&entries);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::LookupFilterRange(int start_height, const CBlockIndex* stop_index,
                                         std::vector<BlockFilter>& filters_out) const
{
    std::vector<DBVal> entries;
    if (!LookupRange(*m_db, m_name, start_height, stop_index, entries)) {
        return false;
    }

    filters_out.resize(entries.size());
    auto filter_pos_it = filters_out.begin();
    for (const auto& entry : entries) {
        if (!ReadFilterFromDisk(entry.pos, entry.hash, *filter_pos_it)) {
            return false;
        }
        ++filter_pos_it;
    }

    return true;
}